

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  BYTE *iStart;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  U32 *pUVar11;
  seqDef *psVar12;
  bool bVar13;
  U32 UVar14;
  uint uVar15;
  size_t sVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong *puVar22;
  BYTE *pBVar23;
  ulong *puVar24;
  ulong uVar25;
  BYTE *ip;
  ulong *puVar26;
  uint uVar27;
  U32 UVar28;
  U32 UVar29;
  uint uVar30;
  int iVar31;
  ulong *puVar32;
  BYTE *local_148;
  ulong local_f0;
  U32 local_e4;
  BYTE *local_80;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  pBVar9 = (ms->window).base;
  pBVar10 = (ms->window).dictBase;
  uVar5 = (ms->window).dictLimit;
  uVar6 = (ms->window).lowLimit;
  iStart = pBVar9 + uVar5;
  UVar29 = *rep;
  UVar28 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  puVar32 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  if (puVar32 < puVar4) {
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    do {
      puVar24 = (ulong *)((long)puVar32 + 1);
      iVar31 = (int)puVar32;
      uVar20 = ((iVar31 - (int)pBVar9) - UVar29) + 1;
      pBVar23 = pBVar9;
      if (uVar20 < uVar5) {
        pBVar23 = pBVar10;
      }
      bVar13 = true;
      if ((uVar6 < uVar20 && 2 < (uVar5 - 1) - uVar20) &&
         (*(int *)puVar24 == *(int *)(pBVar23 + uVar20))) {
        puVar26 = iEnd;
        if (uVar20 < uVar5) {
          puVar26 = (ulong *)(pBVar10 + uVar5);
        }
        sVar16 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar32 + 5),(BYTE *)((long)(pBVar23 + uVar20) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar26,iStart);
        local_80 = (BYTE *)(sVar16 + 4);
        bVar13 = false;
      }
      else {
        local_80 = (BYTE *)0x0;
      }
      if (bVar13) {
        if (cParams->searchLength - 6 < 2) {
          uVar30 = 1 << ((byte)cParams->chainLog & 0x1f);
          pUVar11 = ms->chainTable;
          pBVar23 = (ms->window).base;
          pBVar18 = (ms->window).dictBase;
          uVar20 = (ms->window).dictLimit;
          uVar7 = (ms->window).lowLimit;
          uVar27 = iVar31 - (int)pBVar23;
          uVar21 = uVar27 - uVar30;
          if (uVar27 < uVar30) {
            uVar21 = 0;
          }
          uVar8 = cParams->searchLog;
          uVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar32,6);
          if (uVar7 < uVar15) {
            iVar31 = 1 << ((byte)uVar8 & 0x1f);
            local_f0 = 99999999;
            local_148 = (BYTE *)0x3;
            do {
              if (uVar15 < uVar20) {
                if (*(int *)(pBVar18 + uVar15) == (int)*puVar32) {
                  sVar16 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar32 + 4),pBVar18 + (ulong)uVar15 + 4,
                                      (BYTE *)iEnd,pBVar18 + uVar20,pBVar23 + uVar20);
                  pBVar17 = (BYTE *)(sVar16 + 4);
                }
                else {
LAB_00199b20:
                  pBVar17 = (BYTE *)0x0;
                }
              }
              else {
                puVar26 = (ulong *)(pBVar23 + uVar15);
                if (local_148[(long)puVar26] != *(BYTE *)((long)puVar32 + (long)local_148))
                goto LAB_00199b20;
                puVar22 = puVar32;
                if (puVar32 < puVar1) {
                  uVar19 = *puVar32 ^ *puVar26;
                  uVar25 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  pBVar17 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
                  if (*puVar26 == *puVar32) {
                    do {
                      puVar22 = puVar22 + 1;
                      puVar26 = puVar26 + 1;
                      if (puVar1 <= puVar22) goto LAB_00199b27;
                      uVar19 = *puVar22 ^ *puVar26;
                      uVar25 = 0;
                      if (uVar19 != 0) {
                        for (; (uVar19 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                        }
                      }
                      pBVar17 = (BYTE *)((long)puVar22 +
                                        ((uVar25 >> 3 & 0x1fffffff) - (long)puVar32));
                    } while (*puVar26 == *puVar22);
                  }
                }
                else {
LAB_00199b27:
                  if ((puVar22 < puVar2) && ((int)*puVar26 == (int)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 4);
                    puVar26 = (ulong *)((long)puVar26 + 4);
                  }
                  if ((puVar22 < puVar3) && ((short)*puVar26 == (short)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 2);
                    puVar26 = (ulong *)((long)puVar26 + 2);
                  }
                  if (puVar22 < iEnd) {
                    puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar22));
                  }
                  pBVar17 = (BYTE *)((long)puVar22 - (long)puVar32);
                }
              }
              if ((local_148 < pBVar17) &&
                 (local_f0 = (ulong)((uVar27 + 2) - uVar15), local_148 = pBVar17,
                 (ulong *)((long)puVar32 + (long)pBVar17) == iEnd)) {
                bVar13 = false;
              }
              else if (uVar21 < uVar15) {
                uVar15 = pUVar11[uVar15 & uVar30 - 1];
                bVar13 = true;
              }
              else {
                bVar13 = false;
              }
            } while (((bVar13) && (uVar7 < uVar15)) && (iVar31 = iVar31 + -1, iVar31 != 0));
          }
          else {
            local_148 = (BYTE *)0x3;
            local_f0 = 99999999;
          }
        }
        else if (cParams->searchLength == 5) {
          uVar30 = 1 << ((byte)cParams->chainLog & 0x1f);
          pUVar11 = ms->chainTable;
          pBVar23 = (ms->window).base;
          pBVar18 = (ms->window).dictBase;
          uVar20 = (ms->window).dictLimit;
          uVar7 = (ms->window).lowLimit;
          uVar21 = iVar31 - (int)pBVar23;
          uVar27 = uVar21 - uVar30;
          if (uVar21 < uVar30) {
            uVar27 = 0;
          }
          uVar8 = cParams->searchLog;
          uVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar32,5);
          if (uVar7 < uVar15) {
            iVar31 = 1 << ((byte)uVar8 & 0x1f);
            local_f0 = 99999999;
            local_148 = (BYTE *)0x3;
            do {
              if (uVar15 < uVar20) {
                if (*(int *)(pBVar18 + uVar15) == (int)*puVar32) {
                  sVar16 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar32 + 4),pBVar18 + (ulong)uVar15 + 4,
                                      (BYTE *)iEnd,pBVar18 + uVar20,pBVar23 + uVar20);
                  pBVar17 = (BYTE *)(sVar16 + 4);
                }
                else {
LAB_00199e2d:
                  pBVar17 = (BYTE *)0x0;
                }
              }
              else {
                puVar26 = (ulong *)(pBVar23 + uVar15);
                if (local_148[(long)puVar26] != *(BYTE *)((long)puVar32 + (long)local_148))
                goto LAB_00199e2d;
                puVar22 = puVar32;
                if (puVar32 < puVar1) {
                  uVar19 = *puVar32 ^ *puVar26;
                  uVar25 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  pBVar17 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
                  if (*puVar26 == *puVar32) {
                    do {
                      puVar22 = puVar22 + 1;
                      puVar26 = puVar26 + 1;
                      if (puVar1 <= puVar22) goto LAB_00199e34;
                      uVar19 = *puVar22 ^ *puVar26;
                      uVar25 = 0;
                      if (uVar19 != 0) {
                        for (; (uVar19 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                        }
                      }
                      pBVar17 = (BYTE *)((long)puVar22 +
                                        ((uVar25 >> 3 & 0x1fffffff) - (long)puVar32));
                    } while (*puVar26 == *puVar22);
                  }
                }
                else {
LAB_00199e34:
                  if ((puVar22 < puVar2) && ((int)*puVar26 == (int)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 4);
                    puVar26 = (ulong *)((long)puVar26 + 4);
                  }
                  if ((puVar22 < puVar3) && ((short)*puVar26 == (short)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 2);
                    puVar26 = (ulong *)((long)puVar26 + 2);
                  }
                  if (puVar22 < iEnd) {
                    puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar22));
                  }
                  pBVar17 = (BYTE *)((long)puVar22 - (long)puVar32);
                }
              }
              if ((local_148 < pBVar17) &&
                 (local_f0 = (ulong)((uVar21 + 2) - uVar15), local_148 = pBVar17,
                 (ulong *)((long)puVar32 + (long)pBVar17) == iEnd)) {
                bVar13 = false;
              }
              else if (uVar27 < uVar15) {
                uVar15 = pUVar11[uVar15 & uVar30 - 1];
                bVar13 = true;
              }
              else {
                bVar13 = false;
              }
            } while (((bVar13) && (uVar7 < uVar15)) && (iVar31 = iVar31 + -1, iVar31 != 0));
          }
          else {
LAB_0019a1ba:
            local_148 = (BYTE *)0x3;
            local_f0 = 99999999;
          }
        }
        else {
          uVar30 = 1 << ((byte)cParams->chainLog & 0x1f);
          pUVar11 = ms->chainTable;
          pBVar23 = (ms->window).base;
          pBVar18 = (ms->window).dictBase;
          uVar20 = (ms->window).dictLimit;
          uVar7 = (ms->window).lowLimit;
          uVar21 = iVar31 - (int)pBVar23;
          uVar27 = uVar21 - uVar30;
          if (uVar21 < uVar30) {
            uVar27 = 0;
          }
          uVar8 = cParams->searchLog;
          uVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar32,4);
          if (uVar15 <= uVar7) goto LAB_0019a1ba;
          iVar31 = 1 << ((byte)uVar8 & 0x1f);
          local_f0 = 99999999;
          local_148 = (BYTE *)0x3;
          do {
            if (uVar15 < uVar20) {
              if (*(int *)(pBVar18 + uVar15) == (int)*puVar32) {
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar32 + 4),pBVar18 + (ulong)uVar15 + 4,
                                    (BYTE *)iEnd,pBVar18 + uVar20,pBVar23 + uVar20);
                pBVar17 = (BYTE *)(sVar16 + 4);
              }
              else {
LAB_0019a0fa:
                pBVar17 = (BYTE *)0x0;
              }
            }
            else {
              puVar26 = (ulong *)(pBVar23 + uVar15);
              if (local_148[(long)puVar26] != *(BYTE *)((long)puVar32 + (long)local_148))
              goto LAB_0019a0fa;
              puVar22 = puVar32;
              if (puVar32 < puVar1) {
                uVar19 = *puVar32 ^ *puVar26;
                uVar25 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                pBVar17 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
                if (*puVar26 == *puVar32) {
                  do {
                    puVar22 = puVar22 + 1;
                    puVar26 = puVar26 + 1;
                    if (puVar1 <= puVar22) goto LAB_0019a101;
                    uVar19 = *puVar22 ^ *puVar26;
                    uVar25 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    pBVar17 = (BYTE *)((long)puVar22 + ((uVar25 >> 3 & 0x1fffffff) - (long)puVar32))
                    ;
                  } while (*puVar26 == *puVar22);
                }
              }
              else {
LAB_0019a101:
                if ((puVar22 < puVar2) && ((int)*puVar26 == (int)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 4);
                  puVar26 = (ulong *)((long)puVar26 + 4);
                }
                if ((puVar22 < puVar3) && ((short)*puVar26 == (short)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 2);
                  puVar26 = (ulong *)((long)puVar26 + 2);
                }
                if (puVar22 < iEnd) {
                  puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar22));
                }
                pBVar17 = (BYTE *)((long)puVar22 - (long)puVar32);
              }
            }
            if ((local_148 < pBVar17) &&
               (local_f0 = (ulong)((uVar21 + 2) - uVar15), local_148 = pBVar17,
               (ulong *)((long)puVar32 + (long)pBVar17) == iEnd)) {
              bVar13 = false;
            }
            else if (uVar27 < uVar15) {
              uVar15 = pUVar11[uVar15 & uVar30 - 1];
              bVar13 = true;
            }
            else {
              bVar13 = false;
            }
          } while (((bVar13) && (uVar7 < uVar15)) && (iVar31 = iVar31 + -1, iVar31 != 0));
        }
        local_e4 = 1;
        puVar26 = puVar32;
        if (local_148 <= local_80) {
          local_f0 = 0;
          local_148 = local_80;
          puVar26 = puVar24;
        }
        puVar24 = puVar26;
        if ((BYTE *)0x3 < local_148) {
          if (local_f0 == 0) {
            uVar25 = (ulong)UVar28;
            local_80 = local_148;
          }
          else {
            pBVar17 = (BYTE *)((long)puVar24 + (2 - (long)(pBVar9 + local_f0)));
            pBVar18 = iStart;
            pBVar23 = pBVar9;
            if ((uint)pBVar17 < uVar5) {
              pBVar18 = pBVar10 + uVar6;
              pBVar23 = pBVar10;
            }
            if ((src < puVar24) &&
               (uVar25 = (ulong)pBVar17 & 0xffffffff, pBVar18 < pBVar23 + uVar25)) {
              pBVar23 = pBVar23 + uVar25;
              do {
                puVar32 = (ulong *)((long)puVar24 + -1);
                pBVar23 = pBVar23 + -1;
                if ((*(BYTE *)puVar32 != *pBVar23) ||
                   (local_148 = local_148 + 1, puVar24 = puVar32, puVar32 <= src)) break;
              } while (pBVar18 < pBVar23);
            }
            uVar25 = (ulong)UVar29;
            UVar29 = (int)local_f0 - 2;
            local_e4 = (int)local_f0 + 1;
            local_80 = local_148;
          }
          goto LAB_0019a310;
        }
        puVar32 = (ulong *)((long)puVar32 + ((long)puVar32 - (long)src >> 8) + 1);
      }
      else {
        local_e4 = 1;
        uVar25 = (ulong)UVar28;
LAB_0019a310:
        uVar19 = (long)puVar24 - (long)src;
        puVar26 = (ulong *)seqStore->lit;
        puVar32 = (ulong *)((long)puVar26 + uVar19);
        do {
          *puVar26 = *src;
          puVar26 = puVar26 + 1;
          src = (void *)((long)src + 8);
        } while (puVar26 < puVar32);
        seqStore->lit = seqStore->lit + uVar19;
        if (0xffff < uVar19) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12 = seqStore->sequences;
        psVar12->litLength = (U16)uVar19;
        psVar12->offset = local_e4;
        if ((BYTE *)0xffff < local_80 + -3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12->matchLength = (U16)(local_80 + -3);
        seqStore->sequences = psVar12 + 1;
        src = (void *)((long)puVar24 + (long)local_80);
        puVar32 = (ulong *)src;
        do {
          UVar28 = (U32)uVar25;
          if (puVar4 < puVar32) break;
          uVar20 = (uint)((long)puVar32 - (long)(pBVar9 + uVar25));
          pBVar23 = pBVar9;
          if (uVar20 < uVar5) {
            pBVar23 = pBVar10;
          }
          if ((uVar6 < uVar20 && 2 < (uVar5 - 1) - uVar20) &&
             ((int)*puVar32 ==
              *(int *)(pBVar23 + ((long)puVar32 - (long)(pBVar9 + uVar25) & 0xffffffff)))) {
            puVar24 = iEnd;
            if (uVar20 < uVar5) {
              puVar24 = (ulong *)(pBVar10 + uVar5);
            }
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar32 + 4),
                                (BYTE *)((long)(pBVar23 +
                                               ((long)puVar32 - (long)(pBVar9 + uVar25) & 0xffffffff
                                               )) + 4),(BYTE *)iEnd,(BYTE *)puVar24,iStart);
            *(ulong *)seqStore->lit = *src;
            psVar12 = seqStore->sequences;
            psVar12->litLength = 0;
            psVar12->offset = 1;
            if (0xffff < sVar16 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar12->matchLength = (U16)(sVar16 + 1);
            seqStore->sequences = psVar12 + 1;
            src = (void *)((long)puVar32 + sVar16 + 4);
            bVar13 = true;
            puVar32 = (ulong *)src;
            UVar14 = UVar29;
            UVar29 = UVar28;
          }
          else {
            bVar13 = false;
            UVar14 = UVar28;
          }
          UVar28 = UVar14;
          uVar25 = (ulong)UVar28;
        } while (bVar13);
      }
    } while (puVar32 < puVar4);
  }
  *rep = UVar29;
  rep[1] = UVar28;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 0);
}